

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

int __thiscall Engine::init(Engine *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  IntVar *pIVar2;
  int iVar3;
  char *ctx_00;
  ulong uVar4;
  IntVar *local_30;
  
  ctx_00 = (char *)ctx;
  if ((this->vars).sz != 0) {
    uVar4 = 0;
    do {
      pIVar2 = (this->vars).data[uVar4];
      if ((pIVar2->pinfo).sz == 0) {
        pIVar2->in_queue = true;
      }
      else if (pIVar2->in_queue == false) {
        pIVar2->in_queue = true;
        ctx_00 = (char *)&local_30;
        local_30 = pIVar2;
        vec<IntVar_*>::push(&engine.v_queue,(IntVar **)&local_30);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->vars).sz);
  }
  uVar1 = (this->vars).sz;
  if (so.lazy == false) {
    if (uVar1 != 0) {
      uVar4 = 0;
      do {
        ctx_00 = (char *)0x1;
        IntVar::initVals((this->vars).data[uVar4],true);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (this->vars).sz);
    }
  }
  else if (uVar1 != 0) {
    uVar4 = 0;
    do {
      pIVar2 = (this->vars).data[uVar4];
      if (so.eager_limit < (pIVar2->max).v - (pIVar2->min).v) {
        if (1 < so.verbosity) {
          ctx_00 = "using lazy literal\n";
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"using lazy literal\n",0x13);
        }
        IntVar::specialiseToLL((this->vars).data[uVar4]);
      }
      else {
        IntVar::specialiseToEL(pIVar2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (this->vars).sz);
  }
  process_ircs();
  wf_init();
  if (so.mip == true) {
    MIP::init(mip,(EVP_PKEY_CTX *)ctx_00);
  }
  SAT::init(&sat,(EVP_PKEY_CTX *)ctx_00);
  iVar3 = (*this->problem->_vptr_Problem[1])();
  if (so.ldsb == true) {
    iVar3 = LDSB::init(&ldsb,(EVP_PKEY_CTX *)ctx_00);
  }
  this->finished_init = true;
  return iVar3;
}

Assistant:

void Engine::init() {
	// Get the vars ready
	for (unsigned int i = 0; i < vars.size(); i++) {
		IntVar* v = vars[i];
		if (v->pinfo.size() == 0) {
			v->in_queue = true;
		} else {
			v->pushInQueue();
		}
	}

	if (so.lazy) {
		for (unsigned int i = 0; i < vars.size(); i++) {
			if (vars[i]->getMax() - vars[i]->getMin() <= so.eager_limit) {
				vars[i]->specialiseToEL();
			} else {
				if (so.verbosity >= 2) {
					std::cerr << "using lazy literal\n";
				}
				vars[i]->specialiseToLL();
			}
		}
	} else {
		for (unsigned int i = 0; i < vars.size(); i++) {
			vars[i]->initVals(true);
		}
	}

	// Get the propagators ready

	process_ircs();

	// Get well founded propagators ready

	wf_init();

	// Get MIP propagator ready

	if (so.mip) {
		mip->init();
	}

	// Get SAT propagator ready

	sat.init();

	// Set lits allowed to be in learnt clauses
	problem->restrict_learnable();

	// Get LDSB ready

	if (so.ldsb) {
		ldsb.init();
	}

	// Do MIP presolve

	if (so.mip) {
		mip->presolve();
	}

	// Ready

	finished_init = true;
}